

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  ARKodeERKStepMem step_mem_00;
  N_Vector p_Var1;
  N_Vector p_Var2;
  sunrealtype *psVar3;
  N_Vector *pp_Var4;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  undefined8 uVar5;
  ARKodeERKStepMem step_mem;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  N_Vector yerr;
  N_Vector y;
  int nvec;
  int j;
  int retval;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  ARKodeMem local_10;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x58c,"erkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    step_mem_00 = (ARKodeERKStepMem)in_RDI->step_mem;
    p_Var1 = in_RDI->ycur;
    p_Var2 = in_RDI->tempv1;
    psVar3 = step_mem_00->cvals;
    pp_Var4 = step_mem_00->Xvecs;
    *in_RSI = 0;
    local_24 = 0;
    for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
      psVar3[local_24] = in_RDI->h * step_mem_00->B->b[local_20];
      pp_Var4[local_24] = step_mem_00->F[local_20];
      local_24 = local_24 + 1;
    }
    psVar3[local_24] = 1.0;
    pp_Var4[local_24] = in_RDI->yn;
    local_24 = local_24 + 1;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (0 < step_mem_00->nforcing) {
      for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
        step_mem_00->stage_times[local_20] = step_mem_00->B->c[local_20] * in_RDI->h + in_RDI->tn;
        step_mem_00->stage_coefs[local_20] = in_RDI->h * step_mem_00->B->b[local_20];
      }
      erkStep_ApplyForcing
                (step_mem_00,step_mem_00->stage_times,step_mem_00->stage_coefs,step_mem_00->stages,
                 &local_24);
    }
    local_1c = N_VLinearCombination(local_24,psVar3,pp_Var4,p_Var1);
    if (local_1c == 0) {
      if ((local_10->fixedstep == 0) || (local_10->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        local_24 = 0;
        for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
          psVar3[local_24] =
               local_10->h * (step_mem_00->B->b[local_20] - step_mem_00->B->d[local_20]);
          pp_Var4[local_24] = step_mem_00->F[local_20];
          local_24 = local_24 + 1;
        }
        if (0 < step_mem_00->nforcing) {
          for (local_20 = 0; local_20 < step_mem_00->stages; local_20 = local_20 + 1) {
            step_mem_00->stage_times[local_20] =
                 step_mem_00->B->c[local_20] * local_10->h + local_10->tn;
            step_mem_00->stage_coefs[local_20] =
                 local_10->h * (step_mem_00->B->b[local_20] - step_mem_00->B->d[local_20]);
          }
          erkStep_ApplyForcing
                    (step_mem_00,step_mem_00->stage_times,step_mem_00->stage_coefs,
                     step_mem_00->stages,&local_24);
        }
        local_1c = N_VLinearCombination(local_24,psVar3,pp_Var4,p_Var2);
        if (local_1c != 0) {
          return -0x1c;
        }
        uVar5 = N_VWrmsNorm(p_Var2,local_10->ewt);
        *local_18 = uVar5;
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j = 0; j < step_mem->stages; j++)
  {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /* apply external polynomial forcing */
  if (step_mem->nforcing > 0)
  {
    for (j = 0; j < step_mem->stages; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * step_mem->B->b[j];
    }
    erkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         step_mem->stages, &nvec);
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* Compute yerr (if step adaptivity or error accumulation enabled) */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* apply external polynomial forcing */
    if (step_mem->nforcing > 0)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h *
                                   (step_mem->B->b[j] - step_mem->B->d[j]);
      }
      erkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}